

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

size_t strnappend(char **dest,size_t *dest_allocation,char *source,size_t n)

{
  undefined8 in_RAX;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar5;
  size_t __n;
  undefined7 uVar4;
  
  uVar4 = (undefined7)((ulong)in_RAX >> 8);
  sVar1 = CONCAT71(uVar4,dest == (char **)0x0);
  if (dest_allocation != (size_t *)0x0 && dest != (char **)0x0) {
    pcVar3 = *dest;
    if (pcVar3 == (char *)0x0) {
      sVar1 = CONCAT71(uVar4,*dest_allocation != 0);
      if (source != (char *)0x0 && *dest_allocation == 0) goto LAB_00105197;
    }
    else if (source != (char *)0x0) {
LAB_00105197:
      sVar2 = strlen(source);
      __n = n;
      if (sVar2 < n) {
        __n = sVar2;
      }
      if (n == 0) {
        __n = sVar2;
      }
      if (pcVar3 == (char *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(pcVar3);
      }
      uVar5 = sVar2 + __n + 1;
      if (*dest_allocation < uVar5) {
        sVar1 = uVar5 * 2;
        if (*dest_allocation == 0) {
          pcVar3 = (char *)__ckd_calloc__(sVar1,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                          ,0xb1);
        }
        else {
          pcVar3 = (char *)__ckd_realloc__(pcVar3,sVar1,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                           ,0xb3);
        }
        *dest = pcVar3;
        *dest_allocation = sVar1;
      }
      pcVar3 = strncat(pcVar3,source,__n);
      return (size_t)pcVar3;
    }
  }
  return sVar1;
}

Assistant:

static size_t
strnappend(char **dest, size_t *dest_allocation,
       const char *source, size_t n)
{
    size_t source_len, required_allocation;

    if (dest == NULL || dest_allocation == NULL)
        return -1;
    if (*dest == NULL && *dest_allocation != 0)
        return -1;
    if (source == NULL)
        return *dest_allocation;

    source_len = strlen(source);
    if (n && n < source_len)
        source_len = n;

    required_allocation = (*dest ? strlen(*dest) : 0) + source_len + 1;
    if (*dest_allocation < required_allocation) {
        if (*dest_allocation == 0) {
            *dest = (char *)ckd_calloc(required_allocation * 2, 1);
        } else {
            *dest = (char *)ckd_realloc(*dest, required_allocation * 2);
        }
        *dest_allocation = required_allocation * 2;
    }

    strncat(*dest, source, source_len);

    return *dest_allocation;
}